

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall
FxMemberFunctionCall::Resolve(FxMemberFunctionCall *this,FCompileContext *ctx)

{
  FScriptPosition *sc;
  uint uVar1;
  PStruct *pPVar2;
  Variant *pVVar3;
  bool bVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  int iVar7;
  ulong uVar8;
  PClass *selfcls;
  undefined4 extraout_var;
  PClass *pPVar9;
  PPointer *pPVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PFunction *callee;
  long *plVar11;
  FxExpression *pFVar12;
  FxVMFunctionCall *this_00;
  undefined4 extraout_var_04;
  PClass *pPVar13;
  FxGetClass *this_01;
  FxConstant *pFVar14;
  undefined8 uVar15;
  undefined **ppuVar16;
  undefined4 extraout_var_05;
  char *pcVar17;
  long lVar18;
  PClass *pPVar19;
  char *message;
  char *pcVar20;
  undefined4 uVar21;
  undefined8 unaff_RBP;
  byte bVar22;
  PType *pPVar23;
  PClass *unaff_R15;
  bool bVar24;
  bool writable;
  bool error;
  char local_51;
  undefined4 local_50;
  bool local_49;
  FCompileContext *local_48;
  FScriptPosition *local_40;
  FName local_38;
  FName local_34;
  
  if (ctx->Class == (PStruct *)0x0) goto LAB_005363cc;
  uVar8 = (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar8 != 0) {
    lVar18 = 0;
    do {
      if (*(long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                   lVar18) == 0) {
        pFVar12 = (FxExpression *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
        goto LAB_0053645a;
      }
      lVar18 = lVar18 + 8;
    } while (uVar8 << 3 != lVar18);
  }
  if (this->Self->ExprType == EFX_Identifier) {
    local_34.Index = *(int *)&this->Self[1]._vptr_FxExpression;
    selfcls = (PClass *)FindStructType(&local_34);
    if (selfcls == (PClass *)0x0) goto LAB_00535e6c;
    *(undefined1 *)((long)&this->Self[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_00535e6c:
    selfcls = (PClass *)0x0;
  }
  if (this->Self != (FxExpression *)0x0) {
    iVar7 = (*this->Self->_vptr_FxExpression[2])();
    this->Self = (FxExpression *)CONCAT44(extraout_var,iVar7);
  }
  pPVar13 = PClass::RegistrationInfo.MyClass;
  if (this->Self == (FxExpression *)0x0) goto LAB_005363cc;
  if ((selfcls != (PClass *)0x0) && (this->Self->ValueType == &TypeError->super_PType)) {
    if ((selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
        super_PType.super_PTypeBase.super_DObject.Class == (PClass *)0x0) {
      pPVar9 = (PClass *)
               (*(code *)*(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
                          _vptr_DObject)(selfcls);
      (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.Class = pPVar9;
    }
    pPVar9 = (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject.Class;
    bVar24 = pPVar9 != (PClass *)0x0;
    if (pPVar9 != pPVar13 && bVar24) {
      do {
        pPVar9 = pPVar9->ParentClass;
        bVar24 = pPVar9 != (PClass *)0x0;
        if (pPVar9 == pPVar13) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    bVar22 = 1;
    if ((bVar24) && (unaff_R15 = pPVar13, selfcls->bExported == false)) goto LAB_00535f3a;
    local_50 = 0;
LAB_00536398:
    local_49 = false;
    local_38.Index = (this->MethodName).Index;
    sc = &(this->super_FxExpression).ScriptPosition;
    local_48 = ctx;
    callee = FindClassMemberFunction((PStruct *)selfcls,ctx->Class,&local_38,sc,&local_49);
    if (local_49 == true) goto LAB_005363cc;
    if (callee == (PFunction *)0x0) {
      pcVar17 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar20 = "Unknown function %s\n";
LAB_0053644e:
      pFVar12 = (FxExpression *)0x0;
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar20,pcVar17);
    }
    else {
      if ((bVar22 == 0) || ((((callee->Variants).Array)->Flags & 2) == 0)) {
        pVVar3 = (callee->Variants).Array;
        if ((pVVar3->Flags & 2) == 0) {
LAB_0053640a:
          if ((((callee->Variants).Array)->Flags & 2) == 0) {
            pFVar12 = (FxExpression *)0x0;
          }
          else {
            pFVar12 = this->Self;
          }
          local_40 = sc;
          this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x68);
          FxVMFunctionCall::FxVMFunctionCall
                    (this_00,pFVar12,callee,&this->ArgList,local_40,(bool)((byte)local_50 | bVar22))
          ;
          if (this->Self == pFVar12) {
            this->Self = (FxExpression *)0x0;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          iVar7 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,local_48);
          return (FxExpression *)CONCAT44(extraout_var_04,iVar7);
        }
        if (this->Self->ExprType == EFX_Self) {
          bVar24 = CheckFunctionCompatiblity(sc,local_48->Function,callee);
          if (bVar24) goto LAB_0053640a;
          goto LAB_005363cc;
        }
        if ((pVVar3->UseFlags & 1) != 0) goto LAB_0053640a;
        pcVar17 = FName::NameData.NameArray
                  [*(int *)&(callee->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text;
        pcVar20 = "Function %s cannot be used with a non-self object\n";
        goto LAB_0053644e;
      }
      pPVar13 = dyn_cast<PClass>((DObject *)local_48->Class);
      pPVar9 = dyn_cast<PClass>((DObject *)selfcls);
      if ((pPVar13 == (PClass *)0x0) || (pPVar9 == (PClass *)0x0)) {
LAB_0053662d:
        pcVar17 = FName::NameData.NameArray
                  [(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].
                  Text;
        pcVar20 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        message = "Cannot call non-static function %s::%s from here\n";
      }
      else {
        if (pPVar13 != pPVar9) {
          do {
            pPVar13 = pPVar13->ParentClass;
            if (pPVar13 == pPVar9) break;
          } while (pPVar13 != (PClass *)0x0);
          if (pPVar13 == (PClass *)0x0) goto LAB_0053662d;
        }
        pcVar17 = FName::NameData.NameArray
                  [(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].
                  Text;
        pcVar20 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        message = "Qualified member call to parent class %s::%s is not yet implemented\n";
      }
      pFVar12 = (FxExpression *)0x0;
      FScriptPosition::Message(sc,2,message,pcVar17,pcVar20);
    }
    goto LAB_0053645a;
  }
LAB_00535f3a:
  selfcls = unaff_R15;
  if (this->Self->ExprType == EFX_Super) {
    pPVar13 = dyn_cast<PClass>((DObject *)((ctx->Function->Variants).Array)->SelfClass);
    if (pPVar13 == (PClass *)0x0) {
      uVar21 = 0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Super requires a class type");
    }
    else {
      selfcls = pPVar13->ParentClass;
      pPVar10 = NewPointer((PType *)selfcls,false);
      pFVar12 = this->Self;
      pFVar12->ValueType = (PType *)pPVar10;
      pFVar12->ExprType = EFX_Self;
      uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
  }
  else {
    uVar21 = 0;
  }
  pFVar12 = this->Self;
  pPVar2 = (PStruct *)pFVar12->ValueType;
  if ((pPVar2 != (PStruct *)TypeTextureID) || (uVar1 = (this->MethodName).Index, 4 < uVar1 - 0x27f))
  {
    if (((pPVar2 == TypeVector2) || (pPVar2 == TypeVector3)) &&
       (uVar1 = (this->MethodName).Index, uVar1 - 0x279 < 2)) {
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        plVar11 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar12 = this->Self;
        iVar7 = (this->MethodName).Index;
        *plVar11 = (long)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar11 + 1),&pFVar12->ScriptPosition);
        plVar11[3] = 0;
        *(undefined2 *)(plVar11 + 4) = 0x100;
        *(undefined4 *)((long)plVar11 + 0x24) = 0x3f;
        *plVar11 = (long)&PTR__FxVectorBuiltin_00710c08;
        plVar11[6] = (long)pFVar12;
        *(int *)(plVar11 + 5) = iVar7;
        this->Self = (FxExpression *)0x0;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar12 = (FxExpression *)(**(code **)(*plVar11 + 0x10))(plVar11,ctx);
        return pFVar12;
      }
      goto LAB_0053609b;
    }
    if (pPVar2 == (PStruct *)TypeString) {
      pFVar12->ValueType = (PType *)TypeStringStruct;
    }
    pPVar13 = PPointer::RegistrationInfo.MyClass;
    pPVar23 = pFVar12->ValueType;
    if ((pPVar23->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar7 = (**(pPVar23->super_PTypeBase).super_DObject._vptr_DObject)(pPVar23);
      (pPVar23->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
    }
    pPVar5 = PStruct::RegistrationInfo.MyClass;
    pPVar9 = (pPVar23->super_PTypeBase).super_DObject.Class;
    bVar24 = pPVar9 != (PClass *)0x0;
    if (pPVar9 != pPVar13 && bVar24) {
      do {
        pPVar9 = pPVar9->ParentClass;
        bVar24 = pPVar9 != (PClass *)0x0;
        if (pPVar9 == pPVar13) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    pPVar23 = this->Self->ValueType;
    if (!bVar24) {
      if ((pPVar23->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(pPVar23->super_PTypeBase).super_DObject._vptr_DObject)(pPVar23);
        (pPVar23->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_03,iVar7);
      }
      pPVar13 = (pPVar23->super_PTypeBase).super_DObject.Class;
      bVar24 = pPVar13 != (PClass *)0x0;
      if (pPVar13 != pPVar5 && bVar24) {
        do {
          pPVar13 = pPVar13->ParentClass;
          bVar24 = pPVar13 != (PClass *)0x0;
          if (pPVar13 == pPVar5) break;
        } while (pPVar13 != (PClass *)0x0);
      }
      if (bVar24) {
        local_50 = uVar21;
        iVar7 = (*this->Self->_vptr_FxExpression[4])(this->Self,ctx,&local_51);
        if (((char)iVar7 == '\0') || (local_51 != '\x01')) {
          bVar24 = false;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Invalid expression on left hand side of %s\n",
                     FName::NameData.NameArray[(this->MethodName).Index].Text);
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        }
        else {
          selfcls = (PClass *)this->Self->ValueType;
          pPVar10 = NewPointer((PType *)selfcls,false);
          this->Self->ValueType = (PType *)pPVar10;
          bVar24 = true;
        }
        bVar22 = 0;
        if (!bVar24) {
          return (FxExpression *)0x0;
        }
        goto LAB_00536398;
      }
      pcVar17 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar20 = "Invalid expression on left hand side of %s\n";
      goto LAB_0053644e;
    }
    pPVar13 = (PClass *)pPVar23[1].super_PTypeBase.super_DObject._vptr_DObject;
    if ((pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
        super_PType.super_PTypeBase.super_DObject.Class == (PClass *)0x0) {
      iVar7 = (**(pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_PTypeBase.super_DObject._vptr_DObject)(pPVar13);
      (pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar7);
    }
    pPVar6 = PClass::RegistrationInfo.MyClass;
    pPVar9 = (pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject.Class;
    bVar24 = pPVar9 != (PClass *)0x0;
    pPVar19 = pPVar9;
    if (pPVar9 != pPVar5 && bVar24) {
      do {
        pPVar19 = pPVar19->ParentClass;
        bVar24 = pPVar19 != (PClass *)0x0;
        if (pPVar19 == pPVar5) break;
      } while (pPVar19 != (PClass *)0x0);
    }
    if (bVar24) {
      local_50 = uVar21;
      if (pPVar9 == (PClass *)0x0) {
        iVar7 = (**(pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                   .super_PType.super_PTypeBase.super_DObject._vptr_DObject)(pPVar13);
        (pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
        super_PType.super_PTypeBase.super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar7);
      }
      pPVar9 = (pPVar13->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.super_PTypeBase.super_DObject.Class;
      bVar24 = pPVar9 != (PClass *)0x0;
      if (pPVar9 != pPVar6 && bVar24) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar24 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar6) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      bVar4 = true;
      if ((!bVar24) || ((this->MethodName).Index != 0xd6)) goto LAB_00536315;
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
        pcVar17 = FName::NameData.NameArray[0xd6].Text;
        pcVar20 = "too many parameters in call to %s";
        goto LAB_005362fb;
      }
      this_01 = (FxGetClass *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar12 = this->Self;
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_01->super_FxExpression).ScriptPosition,&pFVar12->ScriptPosition);
      (this_01->super_FxExpression).ValueType = (PType *)0x0;
      (this_01->super_FxExpression).isresolved = false;
      (this_01->super_FxExpression).NeedResult = true;
      (this_01->super_FxExpression).ExprType = EFX_GetClass;
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_00710c70;
      this_01->Self = pFVar12;
      pFVar12 = FxGetClass::Resolve(this_01,ctx);
      bVar4 = false;
    }
    else {
      pcVar17 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar20 = "Left hand side of %s must point to a class object\n";
      local_50 = uVar21;
LAB_005362fb:
      bVar4 = false;
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar20,pcVar17);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      pPVar13 = selfcls;
LAB_00536315:
      selfcls = pPVar13;
      pFVar12 = (FxExpression *)0x0;
    }
    if (!bVar4) {
      return pFVar12;
    }
    bVar22 = 0;
    goto LAB_00536398;
  }
  if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
LAB_0053609b:
    pcVar17 = FName::NameData.NameArray[uVar1].Text;
    pcVar20 = "too many parameters in call to %s";
    goto LAB_0053644e;
  }
  pFVar12->ValueType = (PType *)TypeSInt32;
  switch(uVar1) {
  case 0x27f:
    selfcls = (PClass *)FMemArena::Alloc(&FxAlloc,0x48);
    pPVar23 = (PType *)this->Self;
    pFVar14 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    FxConstant::FxConstant(pFVar14,0,&(this->super_FxExpression).ScriptPosition);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject._vptr_DObject = &PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              ((FScriptPosition *)
               &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                super_PType.super_PTypeBase.super_DObject.Class,
               (FScriptPosition *)&(pPVar23->super_PTypeBase).super_DObject.Class);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject.GCNext = (DObject *)0x0;
    *(undefined2 *)
     &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.ObjectFlags = 0x100;
    uVar15 = 0x3e00000016;
    break;
  case 0x280:
    selfcls = (PClass *)FMemArena::Alloc(&FxAlloc,0x40);
    pPVar23 = (PType *)this->Self;
    pFVar14 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    FxConstant::FxConstant(pFVar14,0,&(this->super_FxExpression).ScriptPosition);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject._vptr_DObject = &PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              ((FScriptPosition *)
               &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                super_PType.super_PTypeBase.super_DObject.Class,
               (FScriptPosition *)&(pPVar23->super_PTypeBase).super_DObject.Class);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject.GCNext = (DObject *)0x0;
    *(undefined2 *)
     &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.ObjectFlags = 0x100;
    *(undefined8 *)
     &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.field_0x24 = 0x11f00000016;
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    HashNext = pPVar23;
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    Symbols.ParentSymbolTable = (PSymbolTable *)pFVar14;
    ppuVar16 = &PTR__FxBinary_0070fea0;
    goto LAB_0053686b;
  case 0x281:
    selfcls = (PClass *)FMemArena::Alloc(&FxAlloc,0x48);
    pPVar23 = (PType *)this->Self;
    pFVar14 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    FxConstant::FxConstant(pFVar14,0,&(this->super_FxExpression).ScriptPosition);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject._vptr_DObject = &PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              ((FScriptPosition *)
               &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                super_PType.super_PTypeBase.super_DObject.Class,
               (FScriptPosition *)&(pPVar23->super_PTypeBase).super_DObject.Class);
    (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject.GCNext = (DObject *)0x0;
    *(undefined2 *)
     &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_PTypeBase.super_DObject.ObjectFlags = 0x100;
    uVar15 = 0x11e00000016;
    break;
  case 0x282:
    selfcls = (PClass *)FMemArena::Alloc(&FxAlloc,0x48);
    pFVar12 = this->Self;
    pFVar14 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    iVar7 = -1;
    goto LAB_005367d5;
  case 0x283:
    selfcls = (PClass *)FMemArena::Alloc(&FxAlloc,0x48);
    pFVar12 = this->Self;
    pFVar14 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
    iVar7 = 0;
LAB_005367d5:
    FxConstant::FxConstant(pFVar14,iVar7,&(this->super_FxExpression).ScriptPosition);
    FxAssign::FxAssign((FxAssign *)selfcls,pFVar12,&pFVar14->super_FxExpression,false);
  default:
    goto switchD_00535ffb_default;
  }
  *(undefined8 *)
   &(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    super_PTypeBase.super_DObject.field_0x24 = uVar15;
  (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  HashNext = pPVar23;
  (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  Symbols.ParentSymbolTable = (PSymbolTable *)pFVar14;
  ppuVar16 = &PTR__FxBinary_0070fe38;
LAB_0053686b:
  (selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  super_PTypeBase.super_DObject._vptr_DObject = ppuVar16;
switchD_00535ffb_default:
  this->Self = (FxExpression *)0x0;
  if (selfcls == (PClass *)0x0) {
    pFVar12 = (FxExpression *)0x0;
  }
  else {
    iVar7 = (*(selfcls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.super_PTypeBase.super_DObject._vptr_DObject[2])(selfcls,ctx);
    pFVar12 = (FxExpression *)CONCAT44(extraout_var_05,iVar7);
  }
  if (pFVar12 == (FxExpression *)0x0) {
LAB_005363cc:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar12 = (FxExpression *)0x0;
  }
  else {
    if (((this->MethodName).Index & 0xfffffffeU) == 0x282) {
      pFVar12->ValueType = &TypeVoid->super_PType;
    }
LAB_0053645a:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  return pFVar12;
}

Assistant:

FxExpression *FxMemberFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	PStruct *cls;
	bool staticonly = false;
	bool novirtual = false;

	PStruct *ccls = nullptr;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	if (Self->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Self)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Self)->noglobal = true;
	}

	SAFE_RESOLVE(Self, ctx);

	if (Self->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				cls = ccls;
				staticonly = true;
				goto isresolved;
			}
		}
	}

	if (Self->ExprType == EFX_Super)
	{
		auto clstype = dyn_cast<PClass>(ctx.Function->Variants[0].SelfClass);
		if (clstype != nullptr)
		{
			// give the node the proper value type now that we know it's properly used.
			cls = clstype->ParentClass;
			Self->ValueType = NewPointer(cls);
			Self->ExprType = EFX_Self;
			novirtual = true;	// super calls are always non-virtual
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Super requires a class type");
		}
	}

	// Note: These builtins would better be relegated to the actual type objects, instead of polluting this file, but that's a task for later.

	// Texture builtins.
	if (Self->ValueType == TypeTextureID)
	{
		if (MethodName == NAME_IsValid || MethodName == NAME_IsNull || MethodName == NAME_Exists || MethodName == NAME_SetInvalid || MethodName == NAME_SetNull)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			// No need to create a dedicated node here, all builtins map directly to trivial operations.
			Self->ValueType = TypeSInt32;	// all builtins treat the texture index as integer.
			FxExpression *x;
			switch (MethodName)
			{
			case NAME_IsValid:
				x = new FxCompareRel('>', Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_IsNull:
				x = new FxCompareEq(TK_Eq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_Exists:
				x = new FxCompareRel(TK_Geq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_SetInvalid:
				x = new FxAssign(Self, new FxConstant(-1, ScriptPosition));
				break;

			case NAME_SetNull:
				x = new FxAssign(Self, new FxConstant(0, ScriptPosition));
				break;
			}
			Self = nullptr;
			SAFE_RESOLVE(x, ctx);
			if (MethodName == NAME_SetInvalid || MethodName == NAME_SetNull) x->ValueType = TypeVoid; // override the default type of the assignment operator.
			delete this;
			return x;
		}
	}

	if (Self->IsVector())
	{
		// handle builtins: Vectors got 2: Length and Unit.
		if (MethodName == NAME_Length || MethodName == NAME_Unit)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			auto x = new FxVectorBuiltin(Self, MethodName);
			Self = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Self->ValueType == TypeString)
	{
		// same for String methods. It also uses a hidden struct type to define them.
		Self->ValueType = TypeStringStruct;
	}

	if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Self->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			if (ptype->IsKindOf(RUNTIME_CLASS(PClass)) && MethodName == NAME_GetClass)
			{
				if (ArgList.Size() > 0)
				{
					ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
					delete this;
					return nullptr;
				}
				auto x = new FxGetClass(Self);
				return x->Resolve(ctx);
			}
			cls = static_cast<PStruct *>(ptype);
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Left hand side of %s must point to a class object\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		bool writable;
		if (Self->RequestAddress(ctx, &writable) && writable)
		{
			cls = static_cast<PStruct*>(Self->ValueType);
			Self->ValueType = NewPointer(Self->ValueType);
		}
		else
		{
			// Cannot be made writable so we cannot use its methods.
			ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	// Todo: handle member calls from instantiated structs.

isresolved:
	bool error = false;
	PFunction *afd = FindClassMemberFunction(cls, ctx.Class, MethodName, ScriptPosition, &error);
	if (error)
	{
		delete this;
		return nullptr;
	}

	if (afd == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown function %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	if (staticonly && (afd->Variants[0].Flags & VARF_Method))
	{
		auto clstype = dyn_cast<PClass>(ctx.Class);
		auto ccls = dyn_cast<PClass>(cls);
		if (clstype == nullptr || ccls == nullptr || !clstype->IsDescendantOf(ccls))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot call non-static function %s::%s from here\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
		else
		{
			// Todo: If this is a qualified call to a parent class function, let it through (but this needs to disable virtual calls later.)
			ScriptPosition.Message(MSG_ERROR, "Qualified member call to parent class %s::%s is not yet implemented\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}

	if (afd->Variants[0].Flags & VARF_Method)
	{
		if (Self->ExprType == EFX_Self)
		{
			if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
			{
				delete this;
				return nullptr;
			}
		}
		else
		{
			// Functions with no Actor usage may not be called through a pointer because they will lose their context.
			if (!(afd->Variants[0].UseFlags & SUF_ACTOR))
			{
				ScriptPosition.Message(MSG_ERROR, "Function %s cannot be used with a non-self object\n", afd->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}

	// do not pass the self pointer to static functions.
	auto self = (afd->Variants[0].Flags & VARF_Method) ? Self : nullptr;
	auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, staticonly|novirtual);
	if (Self == self) Self = nullptr;
	delete this;
	return x->Resolve(ctx);
}